

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O0

TPZVec<int> * __thiscall
TPZDohrSubstructCondense<std::complex<long_double>_>::ScatterVec
          (TPZDohrSubstructCondense<std::complex<long_double>_> *this,ENumbering origin,
          ENumbering destination)

{
  bool bVar1;
  pointer ppVar2;
  ostream *this_00;
  ENumbering in_EDX;
  ENumbering in_ESI;
  TPZVec<int> *in_RDI;
  const_iterator it;
  int64_t *this_01;
  _Self local_38;
  pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>
  local_30;
  _Base_ptr local_28;
  _Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>,_TPZVec<int>_>_>
  local_20;
  TPZVec<int> *this_02;
  TPZVec<int> *local_8;
  
  this_02 = in_RDI;
  std::
  _Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>,_TPZVec<int>_>_>
  ::_Rb_tree_const_iterator(&local_20);
  this_01 = &in_RDI[0x1a].fNElements;
  std::
  pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>
  ::
  pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering_&,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering_&,_true>
            (&local_30,(ENumbering *)&stack0xffffffffffffffe8,(ENumbering *)&stack0xffffffffffffffec
            );
  local_28 = (_Base_ptr)
             std::
             map<std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>,_TPZVec<int>_>_>_>
             ::find((map<std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>,_TPZVec<int>_>_>_>
                     *)this_01,(key_type *)0x1fba966);
  local_20._M_node = local_28;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>,_TPZVec<int>_>_>_>
       ::end((map<std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>,_TPZVec<int>_>_>_>
              *)this_01);
  bVar1 = std::operator!=(&local_20,&local_38);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>,_TPZVec<int>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>,_TPZVec<int>_>_>
                           *)0x1fba9aa);
    local_8 = &ppVar2->second;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,"Gathervec not found");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    TPZVec<int>::Resize(this_02,CONCAT44(in_ESI,in_EDX));
    local_8 = &dummyvec;
  }
  return local_8;
}

Assistant:

const TPZVec<int> &TPZDohrSubstructCondense<TVar>::ScatterVec(ENumbering origin, ENumbering destination) const
{
	typename std::map<std::pair<ENumbering,ENumbering>, TPZVec<int> >::const_iterator it;
	it = fPermutationsScatter.find(std::pair<ENumbering,ENumbering>(destination,origin));
	if(it != fPermutationsScatter.end())
	{
		return it->second;
	}
	else
	{
		LOGPZ_ERROR(logger,"Gathervec not found");
		dummyvec.Resize(0);
		return dummyvec;
	}
}